

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

void __thiscall
MeCab::FreeList<mecab_dictionary_info_t>::~FreeList(FreeList<mecab_dictionary_info_t> *this)

{
  void *in_RDI;
  FreeList<mecab_dictionary_info_t> *unaff_retaddr;
  
  ~FreeList(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }